

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O1

void __thiscall
QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::insertRow
          (FixedColumnMatrix<QFormLayoutItem_*,_2> *this,int r,QFormLayoutItem **value)

{
  iterator iVar1;
  
  iVar1 = QList<QFormLayoutItem_*>::begin(&this->m_storage);
  QPodArrayOps<QFormLayoutItem_*>::insert
            ((QPodArrayOps<QFormLayoutItem_*> *)this,
             (long)iVar1.i + ((long)(r * 2) * 8 - (long)(this->m_storage).d.ptr) >> 3,2,*value);
  QList<QFormLayoutItem_*>::begin(&this->m_storage);
  return;
}

Assistant:

void FixedColumnMatrix<T, NumColumns>::insertRow(int r, const T &value)
{
    typename Storage::iterator it = m_storage.begin();
    it += r * NumColumns;
    m_storage.insert(it, NumColumns, value);
}